

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_internal.c
# Opt level: O1

int mbedtls_rsa_deduce_primes
              (mbedtls_mpi *N,mbedtls_mpi *E,mbedtls_mpi *D,mbedtls_mpi *P,mbedtls_mpi *Q)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  mbedtls_mpi K;
  mbedtls_mpi T;
  ulong local_70;
  mbedtls_mpi local_68;
  size_t local_50;
  mbedtls_mpi local_48;
  
  iVar2 = -4;
  if ((((Q != (mbedtls_mpi *)0x0 && P != (mbedtls_mpi *)0x0) && (P->p == (mbedtls_mpi_uint *)0x0))
      && (Q->p == (mbedtls_mpi_uint *)0x0)) &&
     (((iVar1 = mbedtls_mpi_cmp_int(N,0), 0 < iVar1 && (iVar1 = mbedtls_mpi_cmp_int(D,1), 0 < iVar1)
       ) && ((iVar1 = mbedtls_mpi_cmp_mpi(D,N), iVar1 < 0 &&
             ((iVar1 = mbedtls_mpi_cmp_int(E,1), 0 < iVar1 &&
              (iVar1 = mbedtls_mpi_cmp_mpi(E,N), iVar1 < 0)))))))) {
    mbedtls_mpi_init(&local_68);
    mbedtls_mpi_init(&local_48);
    iVar2 = mbedtls_mpi_mul_mpi(&local_48,D,E);
    if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_sub_int(&local_48,&local_48,1), iVar2 == 0)) {
      sVar3 = mbedtls_mpi_lsb(&local_48);
      if ((short)sVar3 == 0) {
LAB_0011a2b1:
        iVar2 = -4;
      }
      else {
        iVar2 = mbedtls_mpi_shift_r(&local_48,sVar3 & 0xffff);
        if (iVar2 == 0) {
          uVar6 = (uint)*N->p & 7;
          local_50 = sVar3;
          mbedtls_mpi_lset(&local_68,(ulong)(byte)(&DAT_0013d770)[uVar6 == 1]);
          iVar2 = mbedtls_mpi_gcd(P,&local_68,N);
          if (iVar2 == 0) {
            local_70 = (ulong)(uVar6 == 1);
            do {
              iVar2 = mbedtls_mpi_cmp_int(P,1);
              if (iVar2 == 0) {
                iVar2 = mbedtls_mpi_exp_mod(&local_68,&local_68,&local_48,N,Q);
                if (iVar2 != 0) break;
                uVar5 = 1;
                do {
                  iVar2 = mbedtls_mpi_cmp_int(&local_68,1);
                  if (iVar2 == 0) break;
                  iVar2 = mbedtls_mpi_add_int(&local_68,&local_68,1);
                  if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_gcd(P,&local_68,N), iVar2 != 0))
                  goto LAB_0011a0ad;
                  iVar2 = mbedtls_mpi_cmp_int(P,1);
                  if ((iVar2 == 1) && (iVar2 = mbedtls_mpi_cmp_mpi(P,N), iVar2 == -1)) {
                    iVar2 = mbedtls_mpi_div_mpi(Q,(mbedtls_mpi *)0x0,N,P);
                    goto LAB_0011a0ad;
                  }
                  iVar2 = mbedtls_mpi_sub_int(&local_68,&local_68,1);
                  if (((iVar2 != 0) ||
                      (iVar2 = mbedtls_mpi_mul_mpi(&local_68,&local_68,&local_68), iVar2 != 0)) ||
                     (iVar2 = mbedtls_mpi_mod_mpi(&local_68,&local_68,N), iVar2 != 0))
                  goto LAB_0011a0ad;
                  uVar5 = uVar5 + 1;
                } while (uVar5 <= (ushort)local_50);
                iVar2 = mbedtls_mpi_cmp_int(&local_68,1);
                if (iVar2 != 0) goto LAB_0011a2b1;
              }
              if (0x34 < (ushort)local_70) goto LAB_0011a2b1;
              uVar4 = local_70 & 0xffff;
              local_70 = uVar4 + 1;
              mbedtls_mpi_lset(&local_68,(ulong)(byte)(&DAT_0013d771)[uVar4]);
              iVar2 = mbedtls_mpi_gcd(P,&local_68,N);
            } while (iVar2 == 0);
          }
        }
      }
    }
LAB_0011a0ad:
    mbedtls_mpi_free(&local_68);
    mbedtls_mpi_free(&local_48);
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_deduce_primes( mbedtls_mpi const *N,
                     mbedtls_mpi const *E, mbedtls_mpi const *D,
                     mbedtls_mpi *P, mbedtls_mpi *Q )
{
    int ret = 0;

    uint16_t attempt;  /* Number of current attempt  */
    uint16_t iter;     /* Number of squares computed in the current attempt */

    uint16_t order;    /* Order of 2 in DE - 1 */

    mbedtls_mpi T;  /* Holds largest odd divisor of DE - 1     */
    mbedtls_mpi K;  /* Temporary holding the current candidate */

    const unsigned char primes[] = { 2,
           3,    5,    7,   11,   13,   17,   19,   23,
          29,   31,   37,   41,   43,   47,   53,   59,
          61,   67,   71,   73,   79,   83,   89,   97,
         101,  103,  107,  109,  113,  127,  131,  137,
         139,  149,  151,  157,  163,  167,  173,  179,
         181,  191,  193,  197,  199,  211,  223,  227,
         229,  233,  239,  241,  251
    };

    const size_t num_primes = sizeof( primes ) / sizeof( *primes );

    if( P == NULL || Q == NULL || P->p != NULL || Q->p != NULL )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    if( mbedtls_mpi_cmp_int( N, 0 ) <= 0 ||
        mbedtls_mpi_cmp_int( D, 1 ) <= 0 ||
        mbedtls_mpi_cmp_mpi( D, N ) >= 0 ||
        mbedtls_mpi_cmp_int( E, 1 ) <= 0 ||
        mbedtls_mpi_cmp_mpi( E, N ) >= 0 )
    {
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );
    }

    /*
     * Initializations and temporary changes
     */

    mbedtls_mpi_init( &K );
    mbedtls_mpi_init( &T );

    /* T := DE - 1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, D,  E ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &T, &T, 1 ) );

    if( ( order = (uint16_t) mbedtls_mpi_lsb( &T ) ) == 0 )
    {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    /* After this operation, T holds the largest odd divisor of DE - 1. */
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &T, order ) );

    /*
     * Actual work
     */

    /* Skip trying 2 if N == 1 mod 8 */
    attempt = 0;
    if( N->p[0] % 8 == 1 )
        attempt = 1;

    for( ; attempt < num_primes; ++attempt )
    {
        mbedtls_mpi_lset( &K, primes[attempt] );

        /* Check if gcd(K,N) = 1 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( P, &K, N ) );
        if( mbedtls_mpi_cmp_int( P, 1 ) != 0 )
            continue;

        /* Go through K^T + 1, K^(2T) + 1, K^(4T) + 1, ...
         * and check whether they have nontrivial GCD with N. */
        MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &K, &K, &T, N,
                             Q /* temporarily use Q for storing Montgomery
                                * multiplication helper values */ ) );

        for( iter = 1; iter <= order; ++iter )
        {
            /* If we reach 1 prematurely, there's no point
             * in continuing to square K */
            if( mbedtls_mpi_cmp_int( &K, 1 ) == 0 )
                break;

            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &K, &K, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( P, &K, N ) );

            if( mbedtls_mpi_cmp_int( P, 1 ) ==  1 &&
                mbedtls_mpi_cmp_mpi( P, N ) == -1 )
            {
                /*
                 * Have found a nontrivial divisor P of N.
                 * Set Q := N / P.
                 */

                MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( Q, NULL, N, P ) );
                goto cleanup;
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, &K, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &K, &K, &K ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &K, &K, N ) );
        }

        /*
         * If we get here, then either we prematurely aborted the loop because
         * we reached 1, or K holds primes[attempt]^(DE - 1) mod N, which must
         * be 1 if D,E,N were consistent.
         * Check if that's the case and abort if not, to avoid very long,
         * yet eventually failing, computations if N,D,E were not sane.
         */
        if( mbedtls_mpi_cmp_int( &K, 1 ) != 0 )
        {
            break;
        }
    }

    ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;

cleanup:

    mbedtls_mpi_free( &K );
    mbedtls_mpi_free( &T );
    return( ret );
}